

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_request_private.c
# Opt level: O1

nhr_bool nhr_request_recv(nhr_request r)

{
  nhr_bool nVar1;
  ssize_t sVar2;
  time_t tVar3;
  nhr_response pnVar4;
  int *piVar5;
  int iVar6;
  ulong received_len;
  char buff [65536];
  undefined1 auStack_10018 [65536];
  
  sVar2 = recv(r->socket,auStack_10018,0x10000,0);
  iVar6 = (int)sVar2;
  while (0 < iVar6) {
    tVar3 = time((time_t *)0x0);
    r->last_time = tVar3;
    received_len = (ulong)((uint)sVar2 & 0x7fffffff);
    if (r->response == (nhr_response)0x0) {
      pnVar4 = nhr_response_create(auStack_10018,received_len);
      r->response = pnVar4;
    }
    else {
      nhr_response_append(r->response,auStack_10018,received_len);
    }
    sVar2 = recv(r->socket,auStack_10018,0x10000,0);
    iVar6 = (int)sVar2;
  }
  piVar5 = __errno_location();
  nVar1 = '\x01';
  if ((*piVar5 != 0xb) && (*piVar5 != 0x73)) {
    if (r->socket != -1) {
      close(r->socket);
      r->socket = -1;
    }
    nVar1 = '\0';
  }
  return nVar1;
}

Assistant:

nhr_bool nhr_request_recv(nhr_request r) {
	int error_number = -1, len = -1;
	char buff[NHR_RECV_BUFF_SIZE];

	do {
		len = (int)recv(r->socket, buff, NHR_RECV_BUFF_SIZE, 0);
#if defined(NHR_OS_WINDOWS)
		error_number = WSAGetLastError();
#else
		error_number = errno;
#endif
		if (len > 0) {
			r->last_time = time(NULL);
			if (r->response) {
				nhr_response_append(r->response, buff, len);
			} else {
				r->response = nhr_response_create(buff, len);
			}
		}
	} while (len > 0);

	if (error_number != WSAEWOULDBLOCK && error_number != WSAEINPROGRESS) {
		nhr_request_close(r);
		return nhr_false;
	}
	return nhr_true;
}